

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_facelift.c
# Opt level: O1

REF_STATUS
ref_facelift_inverse_eval
          (REF_FACELIFT ref_facelift,REF_INT type,REF_INT id,REF_DBL *xyz,REF_DBL *param)

{
  REF_GEOM ref_geom;
  uint uVar1;
  REF_DBL displacement [3];
  REF_DBL geom_xyz [3];
  double local_68;
  double local_60;
  double local_58;
  REF_DBL local_48;
  REF_DBL local_40;
  REF_DBL local_38;
  
  ref_geom = ref_facelift->grid->geom;
  local_48 = *xyz;
  local_40 = xyz[1];
  local_38 = xyz[2];
  uVar1 = ref_egads_inverse_eval(ref_geom,type,id,&local_48,param);
  if (uVar1 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
           0x2fa,"ref_facelift_inverse_eval",(ulong)uVar1,"inv eval before");
    return uVar1;
  }
  if (ref_facelift->displacement != (REF_DBL *)0x0) {
    uVar1 = ref_facelift_displacement_at(ref_facelift,type,id,param,&local_68);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x300,"ref_facelift_inverse_eval",(ulong)uVar1,"facelift displacement");
      return uVar1;
    }
    local_48 = local_48 - local_68;
    local_40 = local_40 - local_60;
    local_38 = local_38 - local_58;
    uVar1 = ref_egads_inverse_eval(ref_geom,type,id,&local_48,param);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x306,"ref_facelift_inverse_eval",(ulong)uVar1,"inv eval before");
      return uVar1;
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_facelift_inverse_eval(REF_FACELIFT ref_facelift,
                                             REF_INT type, REF_INT id,
                                             REF_DBL *xyz, REF_DBL *param) {
  REF_GEOM ref_geom = ref_facelift_geom(ref_facelift);
  REF_DBL geom_xyz[3];
  REF_DBL displacement[3];

  geom_xyz[0] = xyz[0];
  geom_xyz[1] = xyz[1];
  geom_xyz[2] = xyz[2];
  RSS(ref_egads_inverse_eval(ref_geom, type, id, geom_xyz, param),
      "inv eval before");

  if (ref_facelift_direct(ref_facelift)) {
  } else {
    RSS(ref_facelift_displacement_at(ref_facelift, type, id, param,
                                     displacement),
        "facelift displacement");

    geom_xyz[0] -= displacement[0];
    geom_xyz[1] -= displacement[1];
    geom_xyz[2] -= displacement[2];
    RSS(ref_egads_inverse_eval(ref_geom, type, id, geom_xyz, param),
        "inv eval before");
  }

  return REF_SUCCESS;
}